

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>::
convertTo<QString>(QString *__return_storage_ptr__,
                  QStringBuilder<QStringBuilder<QLatin1String,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
                  *this)

{
  QChar *pQVar1;
  QChar *pQVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  char16_t local_58 [20];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->a).a.m_size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  lVar4 = 0;
  QString::QString(__return_storage_ptr__,lVar3 + 0x10,Uninitialized);
  pQVar1 = (QChar *)(__return_storage_ptr__->d).ptr;
  lVar3 = (this->a).a.m_size;
  QAbstractConcatenable::appendLatin1To((this->a).a,pQVar1);
  builtin_memcpy(local_58,L"0123456789abcdef",0x20);
  pQVar1 = pQVar1 + lVar3;
  do {
    pQVar2 = pQVar1;
    pQVar2->ucs = local_58[*(byte *)((long)&(this->a).b.val + lVar4) & 0xf];
    pQVar2[1].ucs = local_58[*(byte *)((long)&(this->a).b.val + lVar4) >> 4];
    lVar4 = lVar4 + 1;
    pQVar1 = pQVar2 + 2;
  } while ((int)lVar4 != 4);
  builtin_memcpy(local_58,L"0123456789abcdef",0x20);
  lVar3 = 0;
  do {
    pQVar2[lVar3 * 2 + 2].ucs = local_58[*(byte *)((long)&(this->b).val + lVar3) & 0xf];
    pQVar2[lVar3 * 2 + 3].ucs = local_58[*(byte *)((long)&(this->b).val + lVar3) >> 4];
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }